

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O2

vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_> * __thiscall
apngasm::APNGAsm::fileToFrames(APNGAsm *this,string *filePath,uint delayNum,uint delayDen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uchar bop;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  pointer pAVar8;
  pointer pAVar9;
  uchar *puVar10;
  pointer pCVar11;
  pointer pCVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  APNGAsm *__stream;
  size_t sVar19;
  uint w;
  ulong uVar20;
  uint uVar21;
  APNGAsm *pAVar22;
  ulong uVar23;
  bool bVar24;
  uint uVar25;
  ulong __n;
  bool bVar27;
  uint local_d3c;
  uint local_d38;
  uint local_d18;
  uint local_d14;
  CHUNK chunk;
  uchar sig [8];
  APNGFrame frameCur;
  APNGFrame frameRaw;
  APNGFrame frameNext;
  ulong uVar26;
  
  pAVar8 = (this->_frames).
           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pAVar9 = (this->_frames).
           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
           super__Vector_impl_data._M_start;
  __stream = (APNGAsm *)fopen((filePath->_M_dataplus)._M_p,"rb");
  if (__stream != (APNGAsm *)0x0) {
    sVar19 = fread(sig,1,8,(FILE *)__stream);
    bVar24 = false;
    if (sVar19 == 8) {
      pAVar22 = (APNGAsm *)sig;
      iVar15 = png_sig_cmp(pAVar22,0,8);
      bVar24 = false;
      if (iVar15 == 0) {
        uVar16 = read_chunk(pAVar22,(FILE *)__stream,&this->_chunkIHDR);
        bVar24 = false;
        if ((uVar16 == 0x52444849) && ((this->_chunkIHDR).size == 0x19)) {
          puVar10 = (this->_chunkIHDR).p;
          bVar1 = puVar10[8];
          bVar2 = puVar10[9];
          bVar3 = puVar10[10];
          bVar4 = puVar10[0xb];
          w = (uint)bVar2 * 0x10000 + (uint)bVar1 * 0x1000000 | (uint)bVar3 * 0x100 | (uint)bVar4;
          uVar16 = *(uint *)(puVar10 + 0xc);
          uVar25 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                   uVar16 << 0x18;
          uVar26 = (ulong)uVar25;
          __n = (ulong)(uVar25 * w * 4);
          APNGFrame::APNGFrame(&frameRaw);
          APNGFrame::APNGFrame(&frameCur);
          APNGFrame::APNGFrame(&frameNext);
          frameRaw._pixels = (uchar *)operator_new__(__n);
          uVar23 = uVar26 << 6;
          frameRaw._rows = (uchar **)operator_new__(uVar23);
          uVar16 = 0;
          for (uVar20 = 0; uVar26 != uVar20; uVar20 = uVar20 + 1) {
            frameRaw._rows[uVar20] = frameRaw._pixels + uVar16;
            uVar16 = uVar16 + w * 4;
          }
          frameCur._colorType = '\x06';
          frameCur._width = w;
          frameCur._height = uVar25;
          frameCur._pixels = (uchar *)operator_new__(__n);
          frameCur._rows = (uchar **)operator_new__(uVar23);
          iVar15 = ((uint)bVar1 * 0x1000000 + (uint)bVar2 * 0x10000 + (uint)bVar3 * 0x100 +
                   (uint)bVar4) * 4;
          uVar16 = 0;
          for (uVar20 = 0; uVar26 != uVar20; uVar20 = uVar20 + 1) {
            frameCur._rows[uVar20] = frameCur._pixels + uVar16;
            uVar16 = uVar16 + iVar15;
          }
          uVar16 = 0;
          processing_start(this,&frameRaw,false);
          local_d3c = 0;
          local_d38 = 0;
          bop = '\0';
          bVar14 = false;
          bVar24 = false;
          bVar13 = false;
          local_d14 = delayDen;
          local_d18 = delayNum;
          while (pAVar22 = __stream, iVar17 = feof((FILE *)__stream), iVar17 == 0) {
            uVar18 = read_chunk(pAVar22,(FILE *)__stream,&chunk);
            if (uVar18 == 0x4c546361) {
              if (bVar13 || bVar14) goto LAB_00150ab8;
              uVar18 = *(uint *)(chunk.p + 0xc);
              this->_loops = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                             uVar18 << 0x18;
              bVar24 = true;
              bVar14 = true;
LAB_00150e82:
              if (chunk.p != (uchar *)0x0) {
                operator_delete__(chunk.p);
              }
            }
            else {
              if (uVar18 == 0x4c546366) {
                if (bVar13) {
                  if (!bVar14) goto LAB_00150ab8;
                  iVar17 = processing_finish(this);
                  if (iVar17 != 0) goto LAB_00150ec1;
                  frameNext._pixels = (uchar *)operator_new__(__n);
                  frameNext._rows = (uchar **)operator_new__(uVar23);
                  uVar18 = 0;
                  for (uVar20 = 0; uVar26 != uVar20; uVar20 = uVar20 + 1) {
                    frameNext._rows[uVar20] = frameNext._pixels + uVar18;
                    uVar18 = uVar18 + iVar15;
                  }
                  if (local_d38 == 2) {
                    pAVar22 = (APNGAsm *)frameNext._pixels;
                    memcpy(frameNext._pixels,frameCur._pixels,__n);
                    compose_frame(pAVar22,frameCur._rows,frameRaw._rows,bop,uVar16,local_d3c,w,
                                  uVar25);
                    frameCur._delayNum = local_d18;
                    frameCur._delayDen = local_d14;
                    std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::push_back
                              (&this->_frames,&frameCur);
                  }
                  else {
                    compose_frame((APNGAsm *)(ulong)local_d38,frameCur._rows,frameRaw._rows,bop,
                                  uVar16,local_d3c,w,uVar25);
                    frameCur._delayNum = local_d18;
                    frameCur._delayDen = local_d14;
                    std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::push_back
                              (&this->_frames,&frameCur);
                    memcpy(frameNext._pixels,frameCur._pixels,__n);
                    if (local_d38 == 1) {
                      uVar20 = (ulong)uVar25;
                      while (bVar27 = uVar20 != 0, uVar20 = uVar20 - 1, bVar27) {
                        memset(frameNext._rows[local_d3c] + (uVar16 << 2),0,(ulong)(w << 2));
                        local_d3c = local_d3c + 1;
                      }
                    }
                  }
                  frameCur._pixels = frameNext._pixels;
                  frameCur._rows = frameNext._rows;
                }
                uVar16 = *(uint *)(chunk.p + 0xc);
                uVar25 = *(uint *)(chunk.p + 0x10);
                uVar18 = *(uint *)(chunk.p + 0x14);
                uVar7 = *(uint *)(chunk.p + 0x18);
                uVar5 = *(ushort *)(chunk.p + 0x1c);
                uVar6 = *(ushort *)(chunk.p + 0x1e);
                bVar1 = chunk.p[0x20];
                bop = chunk.p[0x21];
                if (bVar13) {
                  *(undefined8 *)((this->_chunkIHDR).p + 8) = *(undefined8 *)(chunk.p + 0xc);
                  processing_start(this,&frameRaw,true);
                }
                else {
                  bVar24 = false;
                }
                uVar21 = (uint)bVar1;
                w = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                    uVar16 << 0x18;
                uVar25 = uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8 |
                         uVar25 << 0x18;
                uVar16 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                         uVar18 << 0x18;
                local_d3c = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                            uVar7 << 0x18;
                local_d18 = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
                local_d14 = (uint)(ushort)(uVar6 << 8 | uVar6 >> 8);
                local_d38 = (uint)bVar1;
                if (((long)(this->_frames).
                           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_frames).
                          super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x430 == (ulong)bVar24) {
                  if (uVar21 == 2) {
                    uVar21 = 1;
                  }
                  bop = '\0';
                  local_d38 = uVar21;
                }
                goto LAB_00150e82;
              }
              if (uVar18 != 0x54416466) {
                if (uVar18 != 0x444e4549) {
                  if (uVar18 != 0x54414449) goto LAB_00150ab8;
                  processing_data(this,chunk.p,chunk.size);
                  bVar13 = true;
                  goto LAB_00150e82;
                }
                if ((bVar13) && (pAVar22 = this, iVar15 = processing_finish(this), iVar15 == 0)) {
                  compose_frame(pAVar22,frameCur._rows,frameRaw._rows,bop,uVar16,local_d3c,w,uVar25)
                  ;
                  frameCur._delayNum = local_d18;
                  frameCur._delayDen = local_d14;
                  std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::push_back
                            (&this->_frames,&frameCur);
                }
                else {
LAB_00150ec1:
                  if (frameCur._rows != (uchar **)0x0) {
                    operator_delete__(frameCur._rows);
                  }
                  if (frameCur._pixels != (uchar *)0x0) {
                    operator_delete__(frameCur._pixels);
                  }
                }
                if (chunk.p != (uchar *)0x0) {
LAB_00150f45:
                  operator_delete__(chunk.p);
                }
                break;
              }
              if (bVar14) {
                png_save_uint_32(chunk.p + 4,chunk.size - 0x10);
                builtin_memcpy(chunk.p + 8,"IDAT",4);
                processing_data(this,chunk.p + 4,chunk.size - 4);
                goto LAB_00150e82;
              }
LAB_00150ab8:
              if ((((((byte)(chunk.p[4] + 0x85) < 0xc6) || ((byte)(chunk.p[4] + 0xa5) < 6)) ||
                   ((byte)(chunk.p[5] + 0x85) < 0xc6)) ||
                  (((byte)(chunk.p[5] + 0xa5) < 6 || ((byte)(chunk.p[6] + 0x85) < 0xc6)))) ||
                 (((byte)(chunk.p[6] + 0xa5) < 6 ||
                  (((byte)(chunk.p[7] + 0x85) < 0xc6 || ((byte)(chunk.p[7] + 0xa5) < 6))))))
              goto LAB_00150f45;
              if (bVar13) goto LAB_00150e82;
              processing_data(this,chunk.p,chunk.size);
              std::vector<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>::push_back
                        (&this->_info_chunks,&chunk);
            }
          }
          if (frameRaw._rows != (uchar **)0x0) {
            operator_delete__(frameRaw._rows);
          }
          if (frameRaw._pixels != (uchar *)0x0) {
            operator_delete__(frameRaw._pixels);
          }
        }
      }
    }
    fclose((FILE *)__stream);
    if (1 < (ulong)(((long)(this->_frames).
                           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_frames).
                          super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x430 -
                   (long)(int)(((long)pAVar8 - (long)pAVar9) / 0x430))) {
      this->_skipFirst = bVar24;
    }
    uVar16 = 0;
    while( true ) {
      pCVar11 = (this->_info_chunks).
                super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar12 = (this->_info_chunks).
                super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)((long)pCVar12 - (long)pCVar11 >> 4) <= (ulong)uVar16) break;
      if (pCVar11[uVar16].p != (uchar *)0x0) {
        operator_delete__(pCVar11[uVar16].p);
      }
      uVar16 = uVar16 + 1;
    }
    if (pCVar12 != pCVar11) {
      (this->_info_chunks).super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>.
      _M_impl.super__Vector_impl_data._M_finish = pCVar11;
    }
    puVar10 = (this->_chunkIHDR).p;
    if (puVar10 != (uchar *)0x0) {
      operator_delete__(puVar10);
    }
  }
  return &this->_frames;
}

Assistant:

const std::vector<APNGFrame>& APNGAsm::fileToFrames(const std::string &filePath, unsigned int delayNum, unsigned int delayDen)
  {
    const int oldFrameCount = _frames.size();
    unsigned int   i, j, id;
    unsigned int   w, h;
    CHUNK chunk;

    FILE * f;
    if ((f = fopen(filePath.c_str(), "rb")) != 0)
    {
      unsigned char sig[8];
      unsigned int  w0, h0, x0, y0;
      unsigned int  delay_num, delay_den, dop, bop, rowbytes, imagesize;
      bool          isAnimated = false;
      bool          skipFirst = false;
      bool          hasInfo = false;

      if (fread(sig, 1, 8, f) == 8 && png_sig_cmp(sig, 0, 8) == 0)
      {
        id = read_chunk(f, &_chunkIHDR);

        if (id == id_IHDR && _chunkIHDR.size == 25)
        {
          w0 = w = png_get_uint_32(_chunkIHDR.p + 8);
          h0 = h = png_get_uint_32(_chunkIHDR.p + 12);
          x0 = 0;
          y0 = 0;
          delay_num = delayNum;
          delay_den = delayDen;
          dop = 0;
          bop = 0;
          rowbytes = w * 4;
          imagesize = h * rowbytes;

          APNGFrame frameRaw;
          APNGFrame frameCur;
          APNGFrame frameNext;

          frameRaw._pixels = new unsigned char[imagesize];
          frameRaw._rows = new png_bytep[h * sizeof(png_bytep)];
          for (j=0; j<h; ++j)
            frameRaw._rows[j] = frameRaw._pixels + j * rowbytes;

          frameCur._width = w;
          frameCur._height = h;
          frameCur._colorType = 6;
          frameCur._pixels = new unsigned char[imagesize];
          frameCur._rows = new png_bytep[h * sizeof(png_bytep)];
          for (j=0; j<h; ++j)
            frameCur._rows[j] = frameCur._pixels + j * rowbytes;

          processing_start((void *)&frameRaw, hasInfo);

          while ( !feof(f) )
          {
            id = read_chunk(f, &chunk);

            if (id == id_acTL && !hasInfo && !isAnimated)
            {
              isAnimated = true;
              skipFirst = true;
              _loops = png_get_uint_32(chunk.p + 12);
            }
            else
            if (id == id_fcTL && (!hasInfo || isAnimated))
            {
              if (hasInfo)
              {
                if (!processing_finish())
                {
                  frameNext._pixels = new unsigned char[imagesize];
                  frameNext._rows = new png_bytep[h * sizeof(png_bytep)];
                  for (j=0; j<h; ++j)
                    frameNext._rows[j] = frameNext._pixels + j * rowbytes;

                  if (dop == 2)
                    memcpy(frameNext._pixels, frameCur._pixels, imagesize);

                  compose_frame(frameCur._rows, frameRaw._rows, bop, x0, y0, w0, h0);
                  frameCur._delayNum = delay_num;
                  frameCur._delayDen = delay_den;
                  _frames.push_back(frameCur);

                  if (dop != 2)
                  {
                    memcpy(frameNext._pixels, frameCur._pixels, imagesize);
                    if (dop == 1)
                      for (j=0; j<h0; j++)
                        memset(frameNext._rows[y0 + j] + x0*4, 0, w0*4);
                  }
                  frameCur._pixels = frameNext._pixels;
                  frameCur._rows = frameNext._rows;
                }
                else
                {
                  delete[] frameCur._rows;
                  delete[] frameCur._pixels;
                  delete[] chunk.p;
                  break;
                }
              }

              // At this point the old frame is done. Let's start a new one.
              w0 = png_get_uint_32(chunk.p + 12);
              h0 = png_get_uint_32(chunk.p + 16);
              x0 = png_get_uint_32(chunk.p + 20);
              y0 = png_get_uint_32(chunk.p + 24);
              delay_num = png_get_uint_16(chunk.p + 28);
              delay_den = png_get_uint_16(chunk.p + 30);
              dop = chunk.p[32];
              bop = chunk.p[33];

              if (hasInfo)
              {
                memcpy(_chunkIHDR.p + 8, chunk.p + 12, 8);
                processing_start((void *)&frameRaw, hasInfo);
              }
              else
                skipFirst = false;

              if (_frames.size() == (skipFirst ? 1 : 0))
              {
                bop = 0;
                if (dop == 2)
                  dop = 1;
              }
            }
            else
            if (id == id_IDAT)
            {
              hasInfo = true;
              processing_data(chunk.p, chunk.size);
            }
            else
            if (id == id_fdAT && isAnimated)
            {
              png_save_uint_32(chunk.p + 4, chunk.size - 16);
              memcpy(chunk.p + 8, "IDAT", 4);
              processing_data(chunk.p + 4, chunk.size - 4);
            }
            else
            if (id == id_IEND)
            {
              if (hasInfo && !processing_finish())
              {
                compose_frame(frameCur._rows, frameRaw._rows, bop, x0, y0, w0, h0);
                frameCur._delayNum = delay_num;
                frameCur._delayDen = delay_den;
                _frames.push_back(frameCur);
              }
              else
              {
                delete[] frameCur._rows;
                delete[] frameCur._pixels;
              }
              delete[] chunk.p;
              break;
            }
            else
            if (notabc(chunk.p[4]) || notabc(chunk.p[5]) || notabc(chunk.p[6]) || notabc(chunk.p[7]))
            {
              delete[] chunk.p;
              break;
            }
            else
            if (!hasInfo)
            {
              processing_data(chunk.p, chunk.size);
              _info_chunks.push_back(chunk);
              continue;
            }
            delete[] chunk.p;
          }
          delete[] frameRaw._rows;
          delete[] frameRaw._pixels;
        }
      }
      fclose(f);

      if(_frames.size() - oldFrameCount > 1)
        setSkipFirst(skipFirst);

      for (i=0; i<_info_chunks.size(); ++i)
        delete[] _info_chunks[i].p;

      _info_chunks.clear();

      delete[] _chunkIHDR.p;
    }
    return _frames;
  }